

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternModel.cpp
# Opt level: O3

void __thiscall PatternModel::moveOrderDown(PatternModel *this)

{
  OrderSwapCmd *this_00;
  QUndoStack *pQVar1;
  QArrayData *local_30 [3];
  
  this_00 = (OrderSwapCmd *)operator_new(0x20);
  OrderSwapCmd::OrderSwapCmd(this_00,this,this->mCursorPattern,this->mCursorPattern + 1);
  QMetaObject::tr((char *)local_30,(char *)&staticMetaObject,0x1b603a);
  QUndoCommand::setText((QString *)this_00);
  if (local_30[0] != (QArrayData *)0x0) {
    LOCK();
    (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_30[0],2,8);
    }
  }
  pQVar1 = Module::undoStack(this->mModule);
  QUndoStack::push((QUndoCommand *)pQVar1);
  return;
}

Assistant:

void PatternModel::moveOrderDown() {
    auto cmd = new OrderSwapCmd(*this, mCursorPattern, mCursorPattern + 1);
    cmd->setText((tr("move order down")));
    mModule.undoStack()->push(cmd);
}